

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Column.cpp
# Opt level: O0

void __thiscall SQLite::Column::Column(Column *this,TStatementPtr *aStmtPtr,int aIndex)

{
  bool bVar1;
  Exception *this_00;
  int aIndex_local;
  TStatementPtr *aStmtPtr_local;
  Column *this_local;
  
  std::shared_ptr<sqlite3_stmt>::shared_ptr(&this->mStmtPtr,aStmtPtr);
  this->mIndex = aIndex;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)aStmtPtr);
  if (!bVar1) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,"Statement was destroyed");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

Column::Column(const Statement::TStatementPtr& aStmtPtr, int aIndex) :
    mStmtPtr(aStmtPtr),
    mIndex(aIndex)
{
    if (!aStmtPtr)
    {
        throw SQLite::Exception("Statement was destroyed");
    }
}